

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GridAxisRegular::GridAxisRegular
          (GridAxisRegular *this,KFLOAT64 InitialXi,KFLOAT64 FinalXi,KUINT16 PointsXi,
          KUINT8 InterleafFactor,KUINT8 AxisType,KUINT16 NumPoints,KUINT16 InitialIndexXi)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__GridAxisRegular_00225f68;
  this->m_f64DomainInitialXi = InitialXi;
  this->m_f64DomainFinalXi = FinalXi;
  this->m_ui16DomainPointsXi = PointsXi;
  this->m_ui8InterleafFactor = InterleafFactor;
  this->m_ui8AxisType = AxisType;
  this->m_ui16NumPoints = NumPoints;
  this->m_ui16InitialIndex = InitialIndexXi;
  return;
}

Assistant:

GridAxisRegular::GridAxisRegular( KFLOAT64 InitialXi, KFLOAT64 FinalXi, KUINT16 PointsXi, KUINT8 InterleafFactor,
                                  KUINT8 AxisType, KUINT16 NumPoints, KUINT16 InitialIndexXi ) :
    m_f64DomainInitialXi( InitialXi ),
    m_f64DomainFinalXi( FinalXi ),
    m_ui16DomainPointsXi( PointsXi ),
    m_ui8InterleafFactor( InterleafFactor ),
    m_ui8AxisType( AxisType ),
    m_ui16NumPoints( NumPoints ),
    m_ui16InitialIndex( InitialIndexXi )
{
}